

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extent_hook_pre_reentrancy(tsdn_t *tsdn,arena_t *arena)

{
  arena_t *paVar1;
  arena_t *in_RSI;
  tsdn_t *in_RDI;
  undefined8 *in_FS_OFFSET;
  tsd_t *tsd;
  tsd_t *tsd_1;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  tsd_t *in_stack_ffffffffffffff90;
  
  if ((in_RDI == (tsdn_t *)0x0) && (*(char *)*in_FS_OFFSET != '\0')) {
    tsd_fetch_slow(in_stack_ffffffffffffff90,(_Bool)in_stack_ffffffffffffff8f);
  }
  paVar1 = arena_get(in_RDI,(uint)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  if (in_RSI == paVar1) {
    pre_reentrancy((tsd_t *)in_RSI,
                   (arena_t *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  }
  else {
    pre_reentrancy((tsd_t *)in_RSI,
                   (arena_t *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  }
  return;
}

Assistant:

static void
extent_hook_pre_reentrancy(tsdn_t *tsdn, arena_t *arena) {
	tsd_t *tsd = tsdn_null(tsdn) ? tsd_fetch() : tsdn_tsd(tsdn);
	if (arena == arena_get(tsd_tsdn(tsd), 0, false)) {
		/*
		 * The only legitimate case of customized extent hooks for a0 is
		 * hooks with no allocation activities.  One such example is to
		 * place metadata on pre-allocated resources such as huge pages.
		 * In that case, rely on reentrancy_level checks to catch
		 * infinite recursions.
		 */
		pre_reentrancy(tsd, NULL);
	} else {
		pre_reentrancy(tsd, arena);
	}
}